

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_macro_info.cpp
# Opt level: O3

string * __thiscall
duckdb::CreateMacroInfo::ToString_abi_cxx11_(string *__return_storage_ptr__,CreateMacroInfo *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer puVar2;
  CreateMacroInfo *pCVar3;
  pointer pMVar4;
  long *plVar5;
  long *plVar6;
  size_type *psVar7;
  unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true> *function;
  pointer this_00;
  string prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_c0;
  undefined1 *local_a0;
  long local_98;
  undefined1 local_90 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  CreateMacroInfo *local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  local_80 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_80;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  this_00 = (this->macros).
            super_vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->macros).
           super_vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_78 = this;
  if (this_00 != puVar2) {
    do {
      if (__return_storage_ptr__->_M_string_length != 0) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      pMVar4 = unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>::
               operator->(this_00);
      (*pMVar4->_vptr_MacroFunction[3])(&local_a0,pMVar4);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a0);
      if (local_a0 != local_90) {
        operator_delete(local_a0);
      }
      this_00 = this_00 + 1;
    } while (this_00 != puVar2);
  }
  local_a0 = local_90;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"CREATE MACRO ","");
  pCVar3 = local_78;
  if ((local_78->super_CreateFunctionInfo).super_CreateInfo.catalog._M_string_length != 0) {
    KeywordHelper::WriteOptionallyQuoted
              (&local_c0,&(local_78->super_CreateFunctionInfo).super_CreateInfo.catalog,'\"',true);
    ::std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_c0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    ::std::__cxx11::string::append((char *)&local_a0);
  }
  if ((pCVar3->super_CreateFunctionInfo).super_CreateInfo.schema._M_string_length != 0) {
    KeywordHelper::WriteOptionallyQuoted
              (&local_c0,&(pCVar3->super_CreateFunctionInfo).super_CreateInfo.schema,'\"',true);
    ::std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_c0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    ::std::__cxx11::string::append((char *)&local_a0);
  }
  KeywordHelper::WriteOptionallyQuoted(&local_c0,&(pCVar3->super_CreateFunctionInfo).name,'\"',true)
  ;
  ::std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_c0._M_dataplus._M_p);
  paVar1 = &local_c0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  local_70[0] = local_60;
  ::std::__cxx11::string::_M_construct<char*>((string *)local_70,local_a0,local_a0 + local_98);
  ::std::__cxx11::string::append((char *)local_70);
  plVar5 = (long *)::std::__cxx11::string::_M_append
                             ((char *)local_70,(ulong)(__return_storage_ptr__->_M_dataplus)._M_p);
  plVar6 = plVar5 + 2;
  if ((long *)*plVar5 == plVar6) {
    local_40 = *plVar6;
    lStack_38 = plVar5[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar6;
    local_50 = (long *)*plVar5;
  }
  local_48 = plVar5[1];
  *plVar5 = (long)plVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)::std::__cxx11::string::append((char *)&local_50);
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_c0.field_2._M_allocated_capacity = *psVar7;
    local_c0.field_2._8_8_ = plVar5[3];
    local_c0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_c0.field_2._M_allocated_capacity = *psVar7;
    local_c0._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_c0._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  return __return_storage_ptr__;
}

Assistant:

string CreateMacroInfo::ToString() const {
	string result;
	for (auto &function : macros) {
		if (!result.empty()) {
			result += ", ";
		}
		result += function->ToSQL();
	}
	// prefix with CREATE MACRO
	string prefix = "CREATE MACRO ";
	if (!catalog.empty()) {
		prefix += KeywordHelper::WriteOptionallyQuoted(catalog);
		prefix += ".";
	}
	if (!schema.empty()) {
		prefix += KeywordHelper::WriteOptionallyQuoted(schema);
		prefix += ".";
	}
	prefix += KeywordHelper::WriteOptionallyQuoted(name);
	result = prefix + " " + result + ";";
	return result;
}